

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O1

void __thiscall
wasm::BranchUtils::BranchAccumulator::visitExpression(BranchAccumulator *this,Expression *curr)

{
  anon_class_8_1_ba1d7401 in_RDX;
  undefined1 local_48 [8];
  NameSet selfBranches;
  
  selfBranches._M_t._M_impl._0_4_ = 0;
  selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&selfBranches;
  selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&selfBranches;
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            ((BranchUtils *)curr,(Expression *)local_48,in_RDX);
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<wasm::Name>>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->branches,
             (_Rb_tree_const_iterator<wasm::Name>)
             selfBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Base_ptr)&selfBranches);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_48);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    auto selfBranches = getUniqueTargets(curr);
    branches.insert(selfBranches.begin(), selfBranches.end());
  }